

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::StateMachine::OnSSDPResponse(StateMachine *this,ParsedURL *url)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *__s1;
  string *in_RSI;
  long in_RDI;
  int addedGatewayIndex;
  GatewayEndpoint gateway;
  value_type *gateway_1;
  int gatewayIndex;
  int gatewayCount;
  LogStringBuffer buffer;
  ParsedURL *in_stack_fffffffffffffbc8;
  LogStringBuffer *in_stack_fffffffffffffbd0;
  GatewayEndpoint *this_00;
  value_type *in_stack_fffffffffffffbd8;
  OutputWorker *in_stack_fffffffffffffbe0;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffffc10;
  GatewayEndpoint local_3c8;
  OutputWorker *local_300;
  int local_2f8;
  int local_2f4;
  string *local_2f0;
  string *local_2e0;
  OutputWorker *local_2d8;
  char *local_2d0;
  char *local_2c8;
  string *local_2c0;
  char *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined1 local_268 [392];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  string *local_c0;
  char *local_b8;
  undefined *local_b0;
  StateMachine *local_a8;
  undefined8 *local_a0;
  undefined *local_98;
  StateMachine *local_90;
  undefined8 *local_88;
  undefined *local_80;
  StateMachine *local_78;
  string *local_70;
  char *local_68;
  StateMachine *local_60;
  undefined8 *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  int gatewayIndex_00;
  string *psVar4;
  StateMachine *in_stack_ffffffffffffffb8;
  
  local_2f0 = in_RSI;
  sVar3 = std::
          vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
          size((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                *)(in_RDI + 0x70));
  local_2f4 = (int)sVar3;
  local_2f8 = 0;
  while( true ) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    if (local_2f4 <= local_2f8) {
      local_2b0 = &ModuleLogger;
      local_2b8 = "Learned of gateway endpoint via SSDP: ";
      local_2c0 = local_2f0;
      local_290 = &ModuleLogger;
      local_294 = 2;
      local_2a0 = "Learned of gateway endpoint via SSDP: ";
      local_2a8 = local_2f0;
      buffer_00 = (LogStringBuffer *)&ModuleLogger;
      local_280 = &ModuleLogger;
      local_284 = 2;
      if (DAT_00329338 < 3) {
        local_c8 = &ModuleLogger;
        local_cc = 2;
        local_d8 = "Learned of gateway endpoint via SSDP: ";
        local_e0 = local_2f0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,Trace);
        local_b0 = &DAT_00329368;
        local_a0 = &ModuleLogger;
        local_b8 = local_d8;
        local_c0 = local_e0;
        local_88 = &ModuleLogger;
        local_a8 = (StateMachine *)local_268;
        local_98 = local_b0;
        local_90 = (StateMachine *)local_268;
        local_80 = local_b0;
        local_78 = (StateMachine *)local_268;
        std::operator<<((ostream *)(local_268 + 0x10),(string *)&DAT_00329368);
        local_58 = &ModuleLogger;
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        std::operator<<((ostream *)&local_a8->API_Lock,local_b8);
        psVar4 = local_70;
        in_stack_ffffffffffffffb8 = local_60;
        std::operator<<((ostream *)&local_60->API_Lock,local_70);
        iVar2 = (int)((ulong)psVar4 >> 0x20);
        in_stack_fffffffffffffbe0 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffffc10,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x20c80e);
      }
      this_00 = &local_3c8;
      GatewayEndpoint::GatewayEndpoint(this_00);
      ParsedURL::operator=(&this_00->URL,in_stack_fffffffffffffbc8);
      std::vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
      push_back((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                 *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
      size((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
            *)(in_RDI + 0x70));
      BeginGatewayXMLRequest(in_stack_ffffffffffffffb8,iVar2);
      GatewayEndpoint::~GatewayEndpoint(this_00);
      return;
    }
    in_stack_fffffffffffffc10 =
         (OutputWorker *)
         std::
         vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
         operator[]((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                     *)(in_RDI + 0x70),(long)local_2f8);
    local_2e0 = local_2f0;
    local_300 = in_stack_fffffffffffffc10;
    local_2d8 = in_stack_fffffffffffffc10;
    __s1 = (char *)std::__cxx11::string::c_str();
    local_2d0 = (char *)std::__cxx11::string::c_str();
    local_2c8 = __s1;
    iVar2 = strcasecmp(__s1,local_2d0);
    gatewayIndex_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    if (iVar2 == 0) break;
    local_2f8 = local_2f8 + 1;
  }
  if ((local_300->field_0xc0 & 1) != 0) {
    return;
  }
  *(undefined4 *)
   &(local_300->QueuePrivate).
    super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ._M_impl._M_node._M_size = 3;
  bVar1 = std::operator==(in_stack_fffffffffffffbd0,
                          (shared_ptr<tonk::gateway::HTTPRequester> *)in_stack_fffffffffffffbc8);
  if (!bVar1) {
    return;
  }
  BeginGatewayXMLRequest(in_stack_ffffffffffffffb8,gatewayIndex_00);
  return;
}

Assistant:

void StateMachine::OnSSDPResponse(const ParsedURL& url)
{
    const int gatewayCount = (int)GatewayEndpoints.size();

    // Find it if it is already in the list
    for (int gatewayIndex = 0; gatewayIndex < gatewayCount; ++gatewayIndex)
    {
        auto& gateway = GatewayEndpoints[gatewayIndex];

        // If it is already known:
        if (gateway.URL == url)
        {
            if (gateway.Completed) {
                return;
            }

            //ModuleLogger.Debug("Gateway already known - Requesting gateway descriptor again: ", url.FullURL);

            // If a gateway is advertised again, attempt to query its descriptor
            // to handle the case where we rejoined the same LAN
            gateway.RetriesRemaining = protocol::kPortMappingRetries;

            // If a request is not in progress:
            if (nullptr == gateway.Requester) {
                // Start a request now for XML descriptor
                BeginGatewayXMLRequest(gatewayIndex);
            }

            return;
        }
    }

    ModuleLogger.Info("Learned of gateway endpoint via SSDP: ", url.FullURL);

    GatewayEndpoint gateway;
    gateway.URL = url;

    GatewayEndpoints.push_back(gateway);
    const int addedGatewayIndex = (int)GatewayEndpoints.size() - 1;

    BeginGatewayXMLRequest(addedGatewayIndex);
}